

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O0

void pzshape::TPZShapeQuad::TransformDerivative2dQ(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  TPZFMatrix<double> *in_RDX;
  int in_ESI;
  int in_EDI;
  double dVar4;
  REAL aux [2];
  int i;
  double in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_RDX,CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                        (int64_t)in_stack_ffffffffffffffe0);
    dVar1 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_RDX,CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                        (int64_t)in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0 = *pdVar3;
    dVar2 = *(double *)(gTrans2dQ + (long)in_EDI * 0x20);
    dVar4 = *(double *)(gTrans2dQ + (long)in_EDI * 0x20 + 0x10) * in_stack_ffffffffffffffe0;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_RDX,CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                        (int64_t)in_stack_ffffffffffffffe0);
    *pdVar3 = dVar2 * dVar1 + dVar4;
    dVar2 = *(double *)(gTrans2dQ + (long)in_EDI * 0x20 + 8);
    dVar4 = *(double *)(gTrans2dQ + (long)in_EDI * 0x20 + 0x18) * in_stack_ffffffffffffffe0;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_RDX,CONCAT44(iVar5,in_stack_ffffffffffffffe8),
                        (int64_t)in_stack_ffffffffffffffe0);
    *pdVar3 = dVar2 * dVar1 + dVar4;
  }
  return;
}

Assistant:

void TPZShapeQuad::TransformDerivative2dQ(int transid, int num, TPZFMatrix<REAL> &in) {
		
		for(int i=0;i<num;i++) {
			REAL aux[2];
			aux[0] = in(0,i);
			aux[1] = in(1,i);
			in(0,i) = gTrans2dQ[transid][0][0]*aux[0]+gTrans2dQ[transid][1][0]*aux[1];
			in(1,i) = gTrans2dQ[transid][0][1]*aux[0]+gTrans2dQ[transid][1][1]*aux[1];
		}
	}